

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TgFullEnumeration(Abc_TgMan_t *pWork,Abc_TgMan_t *pBest)

{
  byte *pbVar1;
  ulong *puVar2;
  char cVar3;
  char cVar4;
  word *pwVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  word *pwVar8;
  undefined8 uVar9;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  ulong *puVar24;
  ulong *puVar25;
  undefined8 *puVar26;
  ulong uVar27;
  undefined8 *puVar28;
  word *pLimit;
  char pFGrps [16];
  uint local_12c;
  Abc_TgMan_t local_f8;
  
  if (pWork->nAlgorithm < 1) {
    Abc_TgFirstPermutation(pWork);
    do {
      bVar11 = pWork->pGroup[0].nGVars;
      pwVar8 = pBest->pTruth;
      uVar19 = (ulong)(uint)(1 << ((char)pWork->nVars - 6U & 0x1f));
      if (pWork->nVars < 7) {
        uVar19 = 1;
      }
      do {
        if ((int)uVar19 < 1) goto LAB_004fb24f;
        lVar18 = uVar19 - 1;
        lVar21 = uVar19 - 1;
        uVar19 = uVar19 - 1;
      } while (pwVar8[lVar21] == pWork->pTruth[lVar18]);
      if (pWork->pTruth[lVar18] <= pwVar8[lVar21]) {
        memcpy(pBest,pWork,0xc0);
        uVar12 = 1 << ((char)pWork->nVars - 6U & 0x1f);
        if (pWork->nVars < 7) {
          uVar12 = 1;
        }
        if (0 < (int)uVar12) {
          pwVar5 = pWork->pTruth;
          uVar19 = 0;
          do {
            pwVar8[uVar19] = pwVar5[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
        }
        pBest->pTruth = pwVar8;
      }
LAB_004fb24f:
      if (pWork->fPhased == 0) {
        if ('\0' < (char)bVar11) {
          uVar19 = 0;
          do {
            cVar4 = pWork->pPerm[uVar19];
            uVar27 = uVar19;
            if (uVar19 != 0) {
              cVar3 = pWork->symPhase[cVar4];
              do {
                if (pWork->symPhase[local_f8.pPerm[(uVar27 - 1 & 0xffffffff) - 0x1c]] <= cVar3)
                goto LAB_004fb2a4;
                local_f8.pPerm[uVar27 - 0x1c] = local_f8.pPerm[(uVar27 - 1 & 0xffffffff) - 0x1c];
                bVar10 = 1 < (long)uVar27;
                uVar27 = uVar27 - 1;
              } while (bVar10);
              uVar27 = 0;
            }
LAB_004fb2a4:
            local_f8.pPerm[(long)(int)uVar27 + -0x1c] = cVar4;
            uVar19 = uVar19 + 1;
          } while (uVar19 != (uint)(int)(char)bVar11);
        }
        if (bVar11 != 0) {
          uVar12 = -1 << (bVar11 & 0x1f);
          if (0xfffffffd < uVar12) {
            uVar12 = 0xfffffffe;
          }
          uVar13 = 0;
          do {
            uVar13 = uVar13 + 1;
            lVar18 = 0;
            do {
              lVar21 = lVar18;
              lVar18 = lVar21 + 1;
            } while ((uVar13 >> ((uint)lVar21 & 0x1f) & 1) == 0);
            for (bVar11 = local_f8.pPerm[lVar21 + -0x1c]; -1 < (char)bVar11;
                bVar11 = pWork->symLink[bVar11]) {
              if (pWork->symPhase[bVar11] != '\0') {
                iVar22 = pWork->nVars + -6;
                uVar23 = 1 << ((byte)iVar22 & 0x1f);
                bVar15 = pWork->pPermTRev[bVar11];
                iVar20 = (int)(char)bVar15;
                puVar25 = pWork->pTruth;
                if (pWork->nVars < 7) {
                  bVar16 = (byte)(1 << (bVar15 & 0x1f));
                  *puVar25 = (s_Truths6[iVar20] & *puVar25) >> (bVar16 & 0x3f) |
                             *puVar25 << (bVar16 & 0x3f) & s_Truths6[iVar20];
                }
                else if ((char)bVar15 < '\x06') {
                  if (iVar22 != 0x1f) {
                    uVar19 = s_Truths6[iVar20];
                    uVar27 = 0;
                    do {
                      bVar16 = (byte)(1 << (bVar15 & 0x1f));
                      puVar25[uVar27] =
                           (puVar25[uVar27] & uVar19) >> (bVar16 & 0x3f) |
                           puVar25[uVar27] << (bVar16 & 0x3f) & uVar19;
                      uVar27 = uVar27 + 1;
                    } while (uVar23 != uVar27);
                  }
                }
                else if (iVar22 != 0x1f) {
                  puVar2 = puVar25 + (int)uVar23;
                  bVar16 = (byte)(iVar20 + -6);
                  uVar23 = 1 << (bVar16 & 0x1f);
                  iVar22 = 2 << (bVar16 & 0x1f);
                  uVar19 = 1;
                  if (1 < (int)uVar23) {
                    uVar19 = (ulong)uVar23;
                  }
                  puVar24 = puVar25 + (int)uVar23;
                  do {
                    if (iVar20 + -6 != 0x1f) {
                      uVar27 = 0;
                      do {
                        uVar6 = puVar25[uVar27];
                        puVar25[uVar27] = puVar24[uVar27];
                        puVar24[uVar27] = uVar6;
                        uVar27 = uVar27 + 1;
                      } while (uVar19 != uVar27);
                    }
                    puVar25 = puVar25 + iVar22;
                    puVar24 = puVar24 + iVar22;
                  } while (puVar25 < puVar2);
                }
                pWork->uPhase = pWork->uPhase ^ 1 << (bVar15 & 0x1f);
              }
            }
            pwVar8 = pBest->pTruth;
            uVar19 = (ulong)(uint)(1 << ((char)pWork->nVars - 6U & 0x1f));
            if (pWork->nVars < 7) {
              uVar19 = 1;
            }
            do {
              if ((int)uVar19 < 1) goto LAB_004fb498;
              lVar18 = uVar19 - 1;
              lVar21 = uVar19 - 1;
              uVar19 = uVar19 - 1;
            } while (pwVar8[lVar21] == pWork->pTruth[lVar18]);
            if (pWork->pTruth[lVar18] <= pwVar8[lVar21]) {
              memcpy(pBest,pWork,0xc0);
              uVar23 = 1 << ((char)pWork->nVars - 6U & 0x1f);
              if (pWork->nVars < 7) {
                uVar23 = 1;
              }
              if (0 < (int)uVar23) {
                pwVar5 = pWork->pTruth;
                uVar19 = 0;
                do {
                  pwVar8[uVar19] = pwVar5[uVar19];
                  uVar19 = uVar19 + 1;
                } while (uVar23 != uVar19);
              }
              pBest->pTruth = pwVar8;
            }
LAB_004fb498:
          } while ((uVar13 ^ uVar12) != 0xffffffff);
        }
      }
      iVar22 = Abc_TgNextPermutation(pWork);
    } while (iVar22 != 0);
  }
  else {
    uVar12 = 1 << ((char)pBest->nVars - 6U & 0x1f);
    if (pBest->nVars < 7) {
      uVar12 = 1;
    }
    if (0 < (int)uVar12) {
      memset(pBest->pTruth,0xff,(ulong)uVar12 << 3);
    }
    if (pWork->fPhased == 0) {
      pVVar7 = pWork->vPhase;
      cVar4 = pWork->pGroup[0].nGVars;
      memcpy(&local_f8,pWork,0xc0);
      uVar12 = 1 << ((char)pWork->nVars - 6U & 0x1f);
      if (pWork->nVars < 7) {
        uVar12 = 1;
      }
      if (0 < (int)uVar12) {
        pwVar8 = pWork->pTruth;
        lVar18 = 0;
        do {
          *(undefined8 *)((long)&Abc_TgPhaseEnumerationScc_pCopy + lVar18) =
               *(undefined8 *)((long)pwVar8 + lVar18);
          lVar18 = lVar18 + 8;
        } while ((ulong)uVar12 << 3 != lVar18);
      }
      local_f8.pTruth = &Abc_TgPhaseEnumerationScc_pCopy;
      if (0 < pVVar7->nSize) {
        iVar22 = local_f8.nVars + -6;
        uVar13 = 1 << ((byte)iVar22 & 0x1f);
        lVar18 = 0;
        local_12c = 0;
        uVar12 = local_f8.uPhase;
        do {
          uVar23 = pVVar7->pArray[lVar18];
          if ('\0' < cVar4) {
            lVar21 = 0;
            do {
              if (((local_12c ^ uVar23) >> ((uint)lVar21 & 0x1f) & 1) != 0) {
                for (bVar11 = pWork->pFGrps[lVar21]; -1 < (char)bVar11;
                    bVar11 = local_f8.symLink[bVar11]) {
                  if (local_f8.symPhase[bVar11] != '\0') {
                    bVar15 = local_f8.pPermTRev[bVar11];
                    uVar14 = (uint)(char)bVar15;
                    if (local_f8.nVars < 7) {
                      bVar15 = (byte)(1 << (bVar15 & 0x1f));
                      Abc_TgPhaseEnumerationScc_pCopy =
                           (s_Truths6[(int)uVar14] & Abc_TgPhaseEnumerationScc_pCopy) >>
                           (bVar15 & 0x3f) |
                           Abc_TgPhaseEnumerationScc_pCopy << (bVar15 & 0x3f) &
                           s_Truths6[(int)uVar14];
                    }
                    else if ((char)bVar15 < '\x06') {
                      if (iVar22 != 0x1f) {
                        uVar19 = s_Truths6[(int)uVar14];
                        puVar25 = &Abc_TgPhaseEnumerationScc_pCopy;
                        uVar27 = (ulong)uVar13;
                        do {
                          bVar16 = (byte)(1 << (bVar15 & 0x1f));
                          *puVar25 = (*puVar25 & uVar19) >> (bVar16 & 0x3f) |
                                     *puVar25 << (bVar16 & 0x3f) & uVar19;
                          puVar25 = puVar25 + 1;
                          uVar27 = uVar27 - 1;
                        } while (uVar27 != 0);
                      }
                    }
                    else if (iVar22 != 0x1f) {
                      bVar15 = (byte)(uVar14 - 6);
                      uVar17 = 1 << (bVar15 & 0x1f);
                      iVar20 = 2 << (bVar15 & 0x1f);
                      uVar19 = 1;
                      if (1 < (int)uVar17) {
                        uVar19 = (ulong)uVar17;
                      }
                      puVar28 = &Abc_TgPhaseEnumerationScc_pCopy;
                      puVar26 = &Abc_TgPhaseEnumerationScc_pCopy + (int)uVar17;
                      do {
                        if (uVar14 - 6 != 0x1f) {
                          uVar27 = 0;
                          do {
                            uVar9 = puVar28[uVar27];
                            puVar28[uVar27] = puVar26[uVar27];
                            puVar26[uVar27] = uVar9;
                            uVar27 = uVar27 + 1;
                          } while (uVar19 != uVar27);
                        }
                        puVar28 = puVar28 + iVar20;
                        puVar26 = puVar26 + iVar20;
                      } while (puVar28 < &Abc_TgPhaseEnumerationScc_pCopy + (int)uVar13);
                    }
                    uVar12 = uVar12 ^ 1 << (uVar14 & 0x1f);
                  }
                }
              }
              lVar21 = lVar21 + 1;
              local_f8.uPhase = uVar12;
            } while (lVar21 != cVar4);
          }
          Abc_TgPermEnumerationScc(&local_f8,pBest);
          lVar18 = lVar18 + 1;
          local_12c = uVar23;
        } while (lVar18 < pVVar7->nSize);
      }
    }
    else {
      Abc_TgPermEnumerationScc(pWork,pBest);
    }
  }
  pbVar1 = (byte *)((long)&pBest->uPhase + 3);
  *pbVar1 = *pbVar1 | 0x40;
  return;
}

Assistant:

static void Abc_TgFullEnumeration(Abc_TgMan_t * pWork, Abc_TgMan_t * pBest)
{
    if (pWork->nAlgorithm > 0)
    {
        Abc_TtFill(pBest->pTruth, Abc_TtWordNum(pBest->nVars));
        Abc_TgPhaseEnumerationScc(pWork, pBest);
    }
    else 
    {
        Abc_TgFirstPermutation(pWork);
        do Abc_TgPhaseEnumeration(pWork, pBest);
        while (Abc_TgNextPermutation(pWork));
    }
    pBest->uPhase |= 1 << 30;
}